

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Record_Query_R_PDU.cpp
# Opt level: O0

KString * __thiscall
KDIS::PDU::Record_Query_R_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Record_Query_R_PDU *this)

{
  bool bVar1;
  ostream *poVar2;
  reference puVar3;
  KINT32 Value;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_240;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_210;
  KString local_1f0;
  KString local_1c0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Record_Query_R_PDU *local_18;
  Record_Query_R_PDU *this_local;
  
  local_18 = this;
  this_local = (Record_Query_R_PDU *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar2 = std::operator<<(local_190,(string *)&local_1c0);
  poVar2 = std::operator<<(poVar2,"-Record Query-R PDU-\n");
  Simulation_Management_Header::GetAsString_abi_cxx11_
            (&local_1f0,&this->super_Simulation_Management_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_1f0);
  poVar2 = std::operator<<(poVar2,"\tRequest ID:                ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32RqId);
  Reliability_Header::GetAsString_abi_cxx11_(&local_210,&this->super_Reliability_Header);
  poVar2 = std::operator<<(poVar2,(string *)&local_210);
  poVar2 = std::operator<<(poVar2,"\tEvent Type:                ");
  DATA_TYPE::ENUMS::GetEnumAsStringEventType_abi_cxx11_
            ((KString *)&citr,(ENUMS *)(ulong)this->m_ui16EvntTyp,Value);
  poVar2 = std::operator<<(poVar2,(string *)&citr);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tTime:                      ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32Time);
  poVar2 = std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<(poVar2,"\tNumber Of Record IDs:      ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->m_ui32NumRecs);
  std::operator<<(poVar2,"\n");
  std::__cxx11::string::~string((string *)&citr);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1c0);
  citrEnd = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(&this->m_vui32RecID);
  local_240._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end(&this->m_vui32RecID);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_240);
    if (!bVar1) break;
    poVar2 = std::operator<<(local_190,"\t");
    puVar3 = __gnu_cxx::
             __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
             ::operator*(&citrEnd);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*puVar3);
    std::operator<<(poVar2,"\n");
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator++(&citrEnd);
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Record_Query_R_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Record Query-R PDU-\n"
       << Simulation_Management_Header::GetAsString()
       << "\tRequest ID:                "   << m_ui32RqId
       << Reliability_Header::GetAsString()
       << "\tEvent Type:                "   << GetEnumAsStringEventType( m_ui16EvntTyp ) << "\n"
       << "\tTime:                      "   << m_ui32Time     << "\n"
       << "\tNumber Of Record IDs:      "   << m_ui32NumRecs  << "\n";

    vector<KUINT32>::const_iterator citr = m_vui32RecID.begin();
    vector<KUINT32>::const_iterator citrEnd = m_vui32RecID.end();

    for( ; citr != citrEnd; ++citr )
    {
        ss << "\t" << *citr << "\n";
    }

    return ss.str();
}